

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

void __thiscall llvm::cl::OptionCategory::registerCategory(OptionCategory *this)

{
  uint *puVar1;
  size_t __n;
  atomic<void_*> aVar2;
  void **ppvVar3;
  void **ppvVar4;
  int iVar5;
  uint *puVar6;
  ulong uVar7;
  uint *puVar8;
  long lVar9;
  bool bVar10;
  pair<llvm::SmallPtrSetIterator<llvm::cl::OptionCategory_*>,_bool> local_50;
  void **local_38;
  
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               object_creator<(anonymous_namespace)::CommandLineParser>::call,
               object_deleter<(anonymous_namespace)::CommandLineParser>::call);
  }
  aVar2._M_b._M_p = GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p;
  local_50.first.super_SmallPtrSetIteratorImpl.Bucket =
       *(void ***)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x50);
  puVar1 = (uint *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x5c);
  puVar8 = (uint *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x58);
  puVar6 = puVar8;
  if (local_50.first.super_SmallPtrSetIteratorImpl.Bucket ==
      *(void ***)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x48)) {
    puVar6 = puVar1;
  }
  local_50.first.super_SmallPtrSetIteratorImpl.End =
       local_50.first.super_SmallPtrSetIteratorImpl.Bucket + *puVar6;
  SmallPtrSetIteratorImpl::AdvanceIfNotValid((SmallPtrSetIteratorImpl *)&local_50);
  ppvVar3 = local_50.first.super_SmallPtrSetIteratorImpl.Bucket;
  local_38 = local_50.first.super_SmallPtrSetIteratorImpl.End;
  if (*(long *)((long)aVar2._M_b._M_p + 0x50) == *(long *)((long)aVar2._M_b._M_p + 0x48)) {
    puVar8 = puVar1;
  }
  local_50.first.super_SmallPtrSetIteratorImpl.Bucket =
       (void **)(*(long *)((long)aVar2._M_b._M_p + 0x50) + (ulong)*puVar8 * 8);
  local_50.first.super_SmallPtrSetIteratorImpl.End =
       local_50.first.super_SmallPtrSetIteratorImpl.Bucket;
  SmallPtrSetIteratorImpl::AdvanceIfNotValid((SmallPtrSetIteratorImpl *)&local_50);
  ppvVar4 = local_50.first.super_SmallPtrSetIteratorImpl.Bucket;
  local_50.first.super_SmallPtrSetIteratorImpl.End = local_38;
  bVar10 = ppvVar3 != local_50.first.super_SmallPtrSetIteratorImpl.Bucket;
  local_50.first.super_SmallPtrSetIteratorImpl.Bucket = ppvVar3;
  if (bVar10) {
    lVar9 = 0;
    do {
      ppvVar3 = local_50.first.super_SmallPtrSetIteratorImpl.Bucket;
      if (local_50.first.super_SmallPtrSetIteratorImpl.End <=
          local_50.first.super_SmallPtrSetIteratorImpl.Bucket) {
        __assert_fail("Bucket < End",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                      ,0x122,
                      "const PtrTy llvm::SmallPtrSetIterator<llvm::cl::OptionCategory *>::operator*() const [PtrTy = llvm::cl::OptionCategory *]"
                     );
      }
      __n = *(size_t *)((long)*local_50.first.super_SmallPtrSetIteratorImpl.Bucket + 8);
      if ((this->Name).Length == __n) {
        if (__n == 0) {
          uVar7 = 1;
        }
        else {
          iVar5 = bcmp((this->Name).Data,**local_50.first.super_SmallPtrSetIteratorImpl.Bucket,__n);
          uVar7 = (ulong)(iVar5 == 0);
        }
      }
      else {
        uVar7 = 0;
      }
      lVar9 = lVar9 + uVar7;
      local_50.first.super_SmallPtrSetIteratorImpl.Bucket = ppvVar3 + 1;
      SmallPtrSetIteratorImpl::AdvanceIfNotValid((SmallPtrSetIteratorImpl *)&local_50);
    } while (local_50.first.super_SmallPtrSetIteratorImpl.Bucket != ppvVar4);
    if (lVar9 != 0) {
      __assert_fail("count_if(RegisteredOptionCategories, [cat](const OptionCategory *Category) { return cat->getName() == Category->getName(); }) == 0 && \"Duplicate option categories\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                    ,0x11a,
                    "void (anonymous namespace)::CommandLineParser::registerCategory(OptionCategory *)"
                   );
    }
  }
  SmallPtrSetImpl<llvm::cl::OptionCategory_*>::insert
            (&local_50,(SmallPtrSetImpl<llvm::cl::OptionCategory_*> *)((long)aVar2._M_b._M_p + 0x48)
             ,this);
  return;
}

Assistant:

void OptionCategory::registerCategory() {
  GlobalParser->registerCategory(this);
}